

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::PoolingLayerParams::ByteSizeLong(PoolingLayerParams *this)

{
  bool bVar1;
  int iVar2;
  PoolingLayerParams_PoolingType PVar3;
  PoolingPaddingTypeCase PVar4;
  size_t sVar5;
  size_t sVar6;
  int cached_size;
  int cached_size_2;
  size_t data_size_1;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  PoolingLayerParams *this_local;
  
  data_size = 0;
  sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->kernelsize_);
  if (sVar5 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    data_size = sVar6 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_kernelsize_cached_byte_size_ = iVar2;
  data_size = sVar5 + data_size;
  sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->stride_);
  if (sVar5 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    data_size = sVar6 + 2 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_stride_cached_byte_size_ = iVar2;
  data_size = sVar5 + data_size;
  PVar3 = type(this);
  if (PVar3 != PoolingLayerParams_PoolingType_MAX) {
    PVar3 = type(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(PVar3);
    data_size = sVar5 + 1 + data_size;
  }
  bVar1 = avgpoolexcludepadding(this);
  if (bVar1) {
    data_size = data_size + 3;
  }
  bVar1 = globalpooling(this);
  if (bVar1) {
    data_size = data_size + 3;
  }
  PVar4 = PoolingPaddingType_case(this);
  switch(PVar4) {
  case POOLINGPADDINGTYPE_NOT_SET:
    break;
  case kValid:
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ValidPadding>
                      ((this->PoolingPaddingType_).valid_);
    data_size = sVar5 + 2 + data_size;
    break;
  case kSame:
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SamePadding>
                      ((this->PoolingPaddingType_).same_);
    data_size = sVar5 + 2 + data_size;
    break;
  case kIncludeLastPixel:
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::PoolingLayerParams_ValidCompletePadding>
                      ((this->PoolingPaddingType_).includelastpixel_);
    data_size = sVar5 + 2 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t PoolingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PoolingLayerParams)
  size_t total_size = 0;

  // repeated uint64 kernelSize = 10;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->kernelsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _kernelsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 stride = 20;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->stride_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _stride_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.PoolingLayerParams.PoolingType type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  // bool avgPoolExcludePadding = 50;
  if (this->avgpoolexcludepadding() != 0) {
    total_size += 2 + 1;
  }

  // bool globalPooling = 60;
  if (this->globalpooling() != 0) {
    total_size += 2 + 1;
  }

  switch (PoolingPaddingType_case()) {
    // .CoreML.Specification.ValidPadding valid = 30;
    case kValid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.valid_);
      break;
    }
    // .CoreML.Specification.SamePadding same = 31;
    case kSame: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.same_);
      break;
    }
    // .CoreML.Specification.PoolingLayerParams.ValidCompletePadding includeLastPixel = 32;
    case kIncludeLastPixel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *PoolingPaddingType_.includelastpixel_);
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}